

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScannerException.cpp
# Opt level: O1

void __thiscall ScannerException::ScannerException(ScannerException *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"scanner error","");
  ANTLRException::ANTLRException(&this->super_ANTLRException,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_ANTLRException = &PTR__ANTLRException_00243c00;
  return;
}

Assistant:

ScannerException::ScannerException()
: ANTLRException("scanner error")
{}